

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O2

void __thiscall
icu_63::FormatParser::getQuoteLiteral(FormatParser *this,UnicodeString *quote,int32_t *itemIndex)

{
  ushort uVar1;
  ushort uVar2;
  char16_t cVar3;
  int iVar4;
  ulong uVar5;
  UnicodeString *this_00;
  
  iVar4 = *itemIndex;
  uVar5 = (ulong)iVar4;
  uVar1 = (quote->fUnion).fStackFields.fLengthAndFlags;
  uVar2 = 2;
  if ((uVar1 & 1) == 0) {
    uVar2 = uVar1 & 0x1e;
  }
  (quote->fUnion).fStackFields.fLengthAndFlags = uVar2;
  cVar3 = icu_63::UnicodeString::doCharAt((UnicodeString *)(&this->field_0x8 + uVar5 * 0x40),0);
  if (cVar3 == L'\'') {
    icu_63::UnicodeString::operator+=(quote,(UnicodeString *)(&this->field_0x8 + uVar5 * 0x40));
    uVar5 = (ulong)(iVar4 + 1);
  }
LAB_002d4ff5:
  do {
    iVar4 = (int)uVar5;
    if (this->itemNumber <= iVar4) {
LAB_002d5073:
      *itemIndex = iVar4;
      return;
    }
    this_00 = (UnicodeString *)(&this->field_0x8 + (long)iVar4 * 0x40);
    cVar3 = icu_63::UnicodeString::doCharAt(this_00,0);
    if (cVar3 != L'\'') {
      icu_63::UnicodeString::operator+=(quote,this_00);
      uVar5 = (ulong)(iVar4 + 1);
      goto LAB_002d4ff5;
    }
    if (this->itemNumber <= iVar4 + 1) {
LAB_002d5068:
      icu_63::UnicodeString::operator+=(quote,this_00);
      goto LAB_002d5073;
    }
    cVar3 = icu_63::UnicodeString::doCharAt
                      ((UnicodeString *)(&this->field_0x8 + (long)(iVar4 + 1) * 0x40),0);
    if (cVar3 != L'\'') goto LAB_002d5068;
    icu_63::UnicodeString::operator+=(quote,this_00);
    uVar5 = (ulong)(iVar4 + 2);
    icu_63::UnicodeString::operator+=
              (quote,(UnicodeString *)(&this->field_0x8 + (long)(iVar4 + 1) * 0x40));
  } while( true );
}

Assistant:

void
FormatParser::getQuoteLiteral(UnicodeString& quote, int32_t *itemIndex) {
    int32_t i = *itemIndex;

    quote.remove();
    if (items[i].charAt(0)==SINGLE_QUOTE) {
        quote += items[i];
        ++i;
    }
    while ( i < itemNumber ) {
        if ( items[i].charAt(0)==SINGLE_QUOTE ) {
            if ( (i+1<itemNumber) && (items[i+1].charAt(0)==SINGLE_QUOTE)) {
                // two single quotes e.g. 'o''clock'
                quote += items[i++];
                quote += items[i++];
                continue;
            }
            else {
                quote += items[i];
                break;
            }
        }
        else {
            quote += items[i];
        }
        ++i;
    }
    *itemIndex=i;
}